

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_7::Validator::EndIfExpr(Validator *this,IfExpr *expr)

{
  bool bVar1;
  Location *local_38;
  IfExpr *expr_local;
  Validator *this_local;
  
  bVar1 = intrusive_list<wabt::Expr>::empty(&expr->false_);
  if (bVar1) {
    local_38 = &(expr->true_).end_loc;
  }
  else {
    local_38 = &expr->false_end_loc;
  }
  this->expr_loc_ = local_38;
  TypeChecker::OnEnd(&this->typechecker_);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::EndIfExpr(IfExpr* expr) {
  expr_loc_ =
      expr->false_.empty() ? &expr->true_.end_loc : &expr->false_end_loc;
  typechecker_.OnEnd();
  return Result::Ok;
}